

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_HVC(DisasContext_conflict1 *s,arg_HVC *a)

{
  uint32_t uVar1;
  TCGContext_conflict1 *pTVar2;
  TCGContext_conflict1 *tcg_ctx;
  uint uVar3;
  TCGTemp *local_28;
  
  uVar3 = (uint)s->features & 0x220;
  if (uVar3 == 0x20) {
    if (s->user == 0) {
      uVar1 = a->imm;
      pTVar2 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_R[0xf] + (long)pTVar2),
                          (long)(int)s->pc_curr);
      local_28 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
      tcg_gen_callN_aarch64(pTVar2,helper_pre_hvc_aarch64,(TCGTemp *)0x0,1,&local_28);
      s->svc_imm = uVar1;
      pTVar2 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_R[0xf] + (long)pTVar2),
                          (long)(int)(s->base).pc_next);
      (s->base).is_jmp = DISAS_TARGET_5;
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return uVar3 == 0x20;
}

Assistant:

static bool trans_HVC(DisasContext *s, arg_HVC *a)
{
    if (!ENABLE_ARCH_7 || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
    } else {
        gen_hvc(s, a->imm);
    }
    return true;
}